

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O2

void display_file(char *fname,boolean complain)

{
  dlb *dp;
  long lVar1;
  char *buf;
  
  dp = dlb_fopen(fname,"r");
  if (dp != (dlb *)0x0) {
    dlb_fseek(dp,0,2);
    lVar1 = dlb_ftell(dp);
    dlb_fseek(dp,0,0);
    buf = (char *)malloc((long)(int)lVar1);
    dlb_fread(buf,(int)lVar1,1,dp);
    dlb_fclose(dp);
    (*windowprocs.win_display_buffer)(buf,complain);
    free(buf);
    return;
  }
  if (complain != '\0') {
    pline("Cannot open \"%s\".",fname);
    return;
  }
  if (program_state.something_worth_saving != 0) {
    doredraw();
    return;
  }
  return;
}

Assistant:

void display_file(const char *fname, boolean complain)
{
	dlb *fp;
	char *buf;
	int fsize;

	fp = dlb_fopen(fname, "r");
	if (!fp) {
	    if (complain) {
		pline("Cannot open \"%s\".", fname);
	    } else if (program_state.something_worth_saving) doredraw();
	} else {
	    dlb_fseek(fp, 0, SEEK_END);
	    fsize = dlb_ftell(fp);
	    dlb_fseek(fp, 0, SEEK_SET);
	    
	    buf = malloc(fsize);
	    dlb_fread(buf, fsize, 1, fp);
	    
	    dlb_fclose(fp);
	    
	    display_buffer(buf, complain);
	    
	    free(buf);
	}
}